

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O0

Int64Vector * __thiscall
CoreML::Specification::OneHotEncoder::mutable_int64categories(OneHotEncoder *this)

{
  bool bVar1;
  Int64Vector *this_00;
  OneHotEncoder *this_local;
  
  bVar1 = has_int64categories(this);
  if (!bVar1) {
    clear_CategoryType(this);
    set_has_int64categories(this);
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->CategoryType_).int64categories_ = this_00;
  }
  return (Int64Vector *)(this->CategoryType_).stringcategories_;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* OneHotEncoder::mutable_int64categories() {
  if (!has_int64categories()) {
    clear_CategoryType();
    set_has_int64categories();
    CategoryType_.int64categories_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.OneHotEncoder.int64Categories)
  return CategoryType_.int64categories_;
}